

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void defer_delete(void)

{
  A *this;
  undefined8 *puVar1;
  A *local_408;
  int local_3d4;
  _UnitTest_Compare local_3d0;
  int local_3bc;
  _UnitTest_Compare local_3b8;
  anon_class_8_1_ba1d6e4e_for_cleanup_function local_3a8;
  defer_raii<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mattkretz[P]defer_tests_test_cpp:24:5)>
  local_3a0;
  defer_raii<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mattkretz[P]defer_tests_test_cpp:24:5)>
  *local_398;
  defer_raii<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mattkretz[P]defer_tests_test_cpp:24:5)>
  *defer_object1;
  _UnitTest_Compare local_388;
  A *local_378;
  A *ptr_1;
  _UnitTest_Compare local_368;
  int local_354;
  _UnitTest_Compare local_350;
  anon_class_8_1_ba1d6e4e_for_cleanup_function local_340;
  defer_raii<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mattkretz[P]defer_tests_test_cpp:17:5)>
  local_338;
  defer_raii<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mattkretz[P]defer_tests_test_cpp:17:5)>
  *local_330;
  defer_raii<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mattkretz[P]defer_tests_test_cpp:17:5)>
  *defer_object0;
  _UnitTest_Compare local_320;
  A *local_310;
  A *ptr;
  int local_2f4;
  _UnitTest_Compare local_2f0;
  _UnitTest_Compare *local_2e0;
  _UnitTest_Compare *local_2d0;
  _UnitTest_Compare *local_2c0;
  _UnitTest_Compare *local_2b0;
  _UnitTest_Compare *local_2a0;
  _UnitTest_Compare *local_290;
  _UnitTest_Compare *local_280;
  _Setprecision local_270;
  _Setprecision local_26c;
  _Setprecision local_268;
  int local_264;
  char *local_260;
  char *local_258;
  char *local_250;
  int *local_248;
  int *local_240;
  _UnitTest_Compare *local_238;
  _Setprecision local_230;
  _Setprecision local_22c;
  _Setprecision local_228;
  int local_224;
  char *local_220;
  char *local_218;
  char *local_210;
  int *local_208;
  int *local_200;
  _UnitTest_Compare *local_1f8;
  _Setprecision local_1f0;
  _Setprecision local_1ec;
  _Setprecision local_1e8;
  int local_1e4;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  int *local_1c8;
  int *local_1c0;
  _UnitTest_Compare *local_1b8;
  _Setprecision local_1b0;
  _Setprecision local_1ac;
  _Setprecision local_1a8;
  int local_1a4;
  char *local_1a0;
  char *local_198;
  char *local_190;
  int *local_188;
  int *local_180;
  _UnitTest_Compare *local_178;
  _Setprecision local_170;
  _Setprecision local_16c;
  _Setprecision local_168;
  int local_164;
  char *local_160;
  char *local_158;
  char *local_150;
  int *local_148;
  int *local_140;
  _UnitTest_Compare *local_138;
  _Setprecision local_130;
  _Setprecision local_12c;
  _Setprecision local_128;
  int local_124;
  char *local_120;
  char *local_118;
  char *local_110;
  int *local_108;
  int *local_100;
  _UnitTest_Compare *local_f8;
  _Setprecision local_f0;
  _Setprecision local_ec;
  _Setprecision local_e8;
  int local_e4;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  int *local_c8;
  int *local_c0;
  _UnitTest_Compare *local_b8;
  undefined1 local_a9;
  _UnitTest_Compare *local_a8;
  undefined1 local_99;
  _UnitTest_Compare *local_98;
  undefined1 local_89;
  _UnitTest_Compare *local_88;
  undefined1 local_79;
  _UnitTest_Compare *local_78;
  undefined1 local_69;
  _UnitTest_Compare *local_68;
  undefined1 local_59;
  _UnitTest_Compare *local_58;
  undefined1 local_49;
  _UnitTest_Compare *local_48;
  undefined8 local_40;
  size_t _ip_6;
  size_t _ip_5;
  size_t _ip_4;
  size_t _ip_3;
  size_t _ip_2;
  size_t _ip_1;
  size_t _ip;
  
  local_2f4 = 0;
  local_240 = &A::n_objects;
  local_248 = &local_2f4;
  local_250 = "A::n_objects";
  local_258 = "0";
  local_260 = "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp";
  local_264 = 0xe;
  _ip_1 = 0x105e88;
  local_2f0.m_ip = 0x105e88;
  local_2f0.m_failed = (bool)((A::n_objects == 0 ^ 0xffU) & 1);
  local_238 = &local_2f0;
  if (local_2f0.m_failed != false) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition(&local_2f0,local_260,local_264);
    UnitTest::_UnitTest_Compare::print(local_250);
    UnitTest::_UnitTest_Compare::print(" (");
    local_268 = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_268);
    UnitTest::_UnitTest_Compare::print<int>(local_240);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print(local_258);
    UnitTest::_UnitTest_Compare::print(" (");
    local_26c = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_26c);
    UnitTest::_UnitTest_Compare::print<int>(local_248);
    local_270 = std::setprecision(6);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_270);
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(*local_240 == *local_248);
  }
  local_48 = &local_2f0;
  local_49 = 0x20;
  if ((local_2f0.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::print(' ');
  }
  local_2e0 = &local_2f0;
  if ((local_2f0.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::printLast();
  }
  this = (A *)operator_new(1);
  A::A(this);
  defer_object0._4_4_ = 1;
  local_200 = &A::n_objects;
  local_208 = (int *)((long)&defer_object0 + 4);
  local_210 = "A::n_objects";
  local_218 = "1";
  local_220 = "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp";
  local_224 = 0x10;
  _ip_2 = 0x10609e;
  local_320.m_ip = 0x10609e;
  local_320.m_failed = (bool)((A::n_objects == 1 ^ 0xffU) & 1);
  local_310 = this;
  local_1f8 = &local_320;
  if (local_320.m_failed != false) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition(&local_320,local_220,local_224);
    UnitTest::_UnitTest_Compare::print(local_210);
    UnitTest::_UnitTest_Compare::print(" (");
    local_228 = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_228);
    UnitTest::_UnitTest_Compare::print<int>(local_200);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print(local_218);
    UnitTest::_UnitTest_Compare::print(" (");
    local_22c = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_22c);
    UnitTest::_UnitTest_Compare::print<int>(local_208);
    local_230 = std::setprecision(6);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_230);
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(*local_200 == *local_208);
  }
  local_58 = &local_320;
  local_59 = 0x20;
  if ((local_320.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::print(' ');
  }
  local_2d0 = &local_320;
  if ((local_320.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::printLast();
  }
  local_340.ptr = &local_310;
  ext::defer<defer_delete()::__0>((ext *)&local_338,&local_340);
  local_330 = &local_338;
  local_354 = 1;
  local_1c0 = &A::n_objects;
  local_1c8 = &local_354;
  local_1d0 = "A::n_objects";
  local_1d8 = "1";
  local_1e0 = "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp";
  local_1e4 = 0x12;
  _ip_3 = 0x1062b7;
  local_350.m_ip = 0x1062b7;
  local_350.m_failed = (bool)((A::n_objects == 1 ^ 0xffU) & 1);
  local_1b8 = &local_350;
  if (local_350.m_failed != false) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition(&local_350,local_1e0,local_1e4);
    UnitTest::_UnitTest_Compare::print(local_1d0);
    UnitTest::_UnitTest_Compare::print(" (");
    local_1e8 = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_1e8);
    UnitTest::_UnitTest_Compare::print<int>(local_1c0);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print(local_1d8);
    UnitTest::_UnitTest_Compare::print(" (");
    local_1ec = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_1ec);
    UnitTest::_UnitTest_Compare::print<int>(local_1c8);
    local_1f0 = std::setprecision(6);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_1f0);
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(*local_1c0 == *local_1c8);
  }
  local_68 = &local_350;
  local_69 = 0x20;
  if ((local_350.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::print(' ');
  }
  local_2c0 = &local_350;
  if ((local_350.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::printLast();
  }
  ext::detail::
  defer_raii<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp:17:5)>
  ::~defer_raii(&local_338);
  ptr_1._4_4_ = 0;
  local_180 = &A::n_objects;
  local_188 = (int *)((long)&ptr_1 + 4);
  local_190 = "A::n_objects";
  local_198 = "0";
  local_1a0 = "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp";
  local_1a4 = 0x14;
  _ip_4 = 0x1064d2;
  local_368.m_ip = 0x1064d2;
  local_368.m_failed = (bool)((A::n_objects == 0 ^ 0xffU) & 1);
  local_178 = &local_368;
  if (local_368.m_failed != false) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition(&local_368,local_1a0,local_1a4);
    UnitTest::_UnitTest_Compare::print(local_190);
    UnitTest::_UnitTest_Compare::print(" (");
    local_1a8 = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_1a8);
    UnitTest::_UnitTest_Compare::print<int>(local_180);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print(local_198);
    UnitTest::_UnitTest_Compare::print(" (");
    local_1ac = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_1ac);
    UnitTest::_UnitTest_Compare::print<int>(local_188);
    local_1b0 = std::setprecision(6);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_1b0);
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(*local_180 == *local_188);
  }
  local_78 = &local_368;
  local_79 = 0x20;
  if ((local_368.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::print(' ');
  }
  local_2b0 = &local_368;
  if ((local_368.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::printLast();
  }
  puVar1 = (undefined8 *)operator_new__(0x12);
  *puVar1 = 10;
  local_378 = (A *)(puVar1 + 1);
  local_408 = local_378;
  do {
    A::A(local_408);
    local_408 = local_408 + 1;
  } while (local_408 != (A *)((long)puVar1 + 0x12));
  defer_object1._4_4_ = 10;
  local_140 = &A::n_objects;
  local_148 = (int *)((long)&defer_object1 + 4);
  local_150 = "A::n_objects";
  local_158 = "10";
  local_160 = "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp";
  local_164 = 0x17;
  _ip_5 = 0x106735;
  local_388.m_ip = 0x106735;
  local_388.m_failed = (bool)((A::n_objects == 10 ^ 0xffU) & 1);
  local_138 = &local_388;
  if (local_388.m_failed != false) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition(&local_388,local_160,local_164);
    UnitTest::_UnitTest_Compare::print(local_150);
    UnitTest::_UnitTest_Compare::print(" (");
    local_168 = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_168);
    UnitTest::_UnitTest_Compare::print<int>(local_140);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print(local_158);
    UnitTest::_UnitTest_Compare::print(" (");
    local_16c = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_16c);
    UnitTest::_UnitTest_Compare::print<int>(local_148);
    local_170 = std::setprecision(6);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_170);
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(*local_140 == *local_148);
  }
  local_88 = &local_388;
  local_89 = 0x20;
  if ((local_388.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::print(' ');
  }
  local_2a0 = &local_388;
  if ((local_388.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::printLast();
  }
  local_3a8.ptr = &local_378;
  ext::defer<defer_delete()::__1>((ext *)&local_3a0,&local_3a8);
  local_398 = &local_3a0;
  local_3bc = 10;
  local_100 = &A::n_objects;
  local_108 = &local_3bc;
  local_110 = "A::n_objects";
  local_118 = "10";
  local_120 = "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp";
  local_124 = 0x19;
  _ip_6 = 0x106954;
  local_3b8.m_ip = 0x106954;
  local_3b8.m_failed = (bool)((A::n_objects == 10 ^ 0xffU) & 1);
  local_f8 = &local_3b8;
  if (local_3b8.m_failed != false) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition(&local_3b8,local_120,local_124);
    UnitTest::_UnitTest_Compare::print(local_110);
    UnitTest::_UnitTest_Compare::print(" (");
    local_128 = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_128);
    UnitTest::_UnitTest_Compare::print<int>(local_100);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print(local_118);
    UnitTest::_UnitTest_Compare::print(" (");
    local_12c = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_12c);
    UnitTest::_UnitTest_Compare::print<int>(local_108);
    local_130 = std::setprecision(6);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_130);
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(*local_100 == *local_108);
  }
  local_98 = &local_3b8;
  local_99 = 0x20;
  if ((local_3b8.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::print(' ');
  }
  local_290 = &local_3b8;
  if ((local_3b8.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::printLast();
  }
  ext::detail::
  defer_raii<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp:24:5)>
  ::~defer_raii(&local_3a0);
  local_3d4 = 0;
  local_c0 = &A::n_objects;
  local_c8 = &local_3d4;
  local_d0 = "A::n_objects";
  local_d8 = "0";
  local_e0 = "/workspace/llm4binary/github/license_c_cmakelists/mattkretz[P]defer/tests/test.cpp";
  local_e4 = 0x1b;
  local_40 = 0x106b7b;
  local_3d0.m_ip = 0x106b7b;
  local_3d0.m_failed = (bool)((A::n_objects == 0 ^ 0xffU) & 1);
  local_b8 = &local_3d0;
  if (local_3d0.m_failed != false) {
    UnitTest::_UnitTest_Compare::printFirst();
    UnitTest::_UnitTest_Compare::printPosition(&local_3d0,local_e0,local_e4);
    UnitTest::_UnitTest_Compare::print(local_d0);
    UnitTest::_UnitTest_Compare::print(" (");
    local_e8 = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_e8);
    UnitTest::_UnitTest_Compare::print<int>(local_c0);
    UnitTest::_UnitTest_Compare::print(") == ");
    UnitTest::_UnitTest_Compare::print(local_d8);
    UnitTest::_UnitTest_Compare::print(" (");
    local_ec = std::setprecision(10);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_ec);
    UnitTest::_UnitTest_Compare::print<int>(local_c8);
    local_f0 = std::setprecision(6);
    UnitTest::_UnitTest_Compare::print<std::_Setprecision>(&local_f0);
    UnitTest::_UnitTest_Compare::print(") -> ");
    UnitTest::_UnitTest_Compare::print(*local_c0 == *local_c8);
  }
  local_a8 = &local_3d0;
  local_a9 = 0x20;
  if ((local_3d0.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::print(' ');
  }
  local_280 = &local_3d0;
  if ((local_3d0.m_failed & 1U) != 0) {
    UnitTest::_UnitTest_Compare::printLast();
  }
  return;
}

Assistant:

TEST(defer_delete) {
  {
    COMPARE(A::n_objects, 0);
    A *ptr = new A;
    COMPARE(A::n_objects, 1);
    DEFER({ delete ptr; });
    COMPARE(A::n_objects, 1);
  }
  COMPARE(A::n_objects, 0);
  {
    A *ptr = new A[10];
    COMPARE(A::n_objects, 10);
    DEFER({ delete[] ptr; });
    COMPARE(A::n_objects, 10);
  }
  COMPARE(A::n_objects, 0);
}